

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O0

SubControl __thiscall QToolButtonPrivate::newHoverControl(QToolButtonPrivate *this,QPoint *pos)

{
  undefined4 uVar1;
  QToolButton *pQVar2;
  QStyle *pQVar3;
  undefined8 in_RSI;
  QToolButtonPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar4;
  QToolButton *q;
  QStyleOptionToolButton opt;
  undefined4 in_stack_ffffffffffffff08;
  SubControl in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  SubControl SVar5;
  undefined8 local_b4;
  undefined8 local_ac;
  undefined1 local_a0 [152];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  memset(local_a0,0xaa,0x98);
  QStyleOptionToolButton::QStyleOptionToolButton((QStyleOptionToolButton *)0x70a138);
  (**(code **)(*(long *)&(pQVar2->super_QAbstractButton).super_QWidget + 0x1b8))(pQVar2,local_a0);
  QFlags<QStyle::SubControl>::QFlags
            ((QFlags<QStyle::SubControl> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_stack_ffffffffffffff0c
            );
  pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  uVar1 = (**(code **)(*(long *)pQVar3 + 0xd0))(pQVar3,4,local_a0,in_RSI,pQVar2);
  *(undefined4 *)&(in_RDI->super_QAbstractButtonPrivate).field_0x2b4 = uVar1;
  if (*(int *)&(in_RDI->super_QAbstractButtonPrivate).field_0x2b4 == 0) {
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    (in_RDI->hoverRect).x1 = (Representation)(undefined4)local_b4;
    (in_RDI->hoverRect).y1 = (Representation)local_b4._4_4_;
    (in_RDI->hoverRect).x2 = (Representation)(undefined4)local_ac;
    (in_RDI->hoverRect).y2 = (Representation)local_ac._4_4_;
  }
  else {
    pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                           );
    QVar4 = (QRect)(**(code **)(*(long *)pQVar3 + 0xd8))
                             (pQVar3,4,local_a0,
                              *(undefined4 *)&(in_RDI->super_QAbstractButtonPrivate).field_0x2b4,
                              pQVar2);
    in_RDI->hoverRect = QVar4;
  }
  SVar5 = *(SubControl *)&(in_RDI->super_QAbstractButtonPrivate).field_0x2b4;
  QStyleOptionToolButton::~QStyleOptionToolButton
            ((QStyleOptionToolButton *)CONCAT44(SVar5,in_stack_ffffffffffffff10));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return SVar5;
  }
  __stack_chk_fail();
}

Assistant:

QStyle::SubControl QToolButtonPrivate::newHoverControl(const QPoint &pos)
{
    Q_Q(QToolButton);
    QStyleOptionToolButton opt;
    q->initStyleOption(&opt);
    opt.subControls = QStyle::SC_All;
    hoverControl = q->style()->hitTestComplexControl(QStyle::CC_ToolButton, &opt, pos, q);
    if (hoverControl == QStyle::SC_None)
        hoverRect = QRect();
    else
        hoverRect = q->style()->subControlRect(QStyle::CC_ToolButton, &opt, hoverControl, q);
    return hoverControl;
}